

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall Fossilize::DumbDirectoryDatabase::prepare(DumbDirectoryDatabase *this)

{
  bool bVar1;
  int iVar2;
  char *__name;
  Hash local_38;
  uint64_t value;
  dirent *pdStack_28;
  uint tag;
  dirent *pEntry;
  DIR *dp;
  DumbDirectoryDatabase *this_local;
  
  if (this->mode == OverWrite) {
    this_local._7_1_ = true;
  }
  else {
    dp = (DIR *)this;
    __name = (char *)std::__cxx11::string::c_str();
    pEntry = (dirent *)opendir(__name);
    if (pEntry == (dirent *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      while (pdStack_28 = readdir((DIR *)pEntry), pdStack_28 != (dirent *)0x0) {
        bVar1 = std::atomic<bool>::load((atomic<bool> *)&shutdown_requested,memory_order_relaxed);
        if (bVar1) {
          return false;
        }
        if ((((pdStack_28->d_type == '\b') &&
             (iVar2 = __isoc99_sscanf(pdStack_28->d_name,"%x.%lx.json",(long)&value + 4,&local_38),
             iVar2 == 2)) && (value._4_4_ < RESOURCE_COUNT)) &&
           (bVar1 = DatabaseInterface::test_resource_filter
                              (&this->super_DatabaseInterface,value._4_4_,local_38), bVar1)) {
          std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::insert(this->seen_blobs + value._4_4_,&local_38);
        }
      }
      closedir((DIR *)pEntry);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool prepare() override
	{
		if (mode == DatabaseMode::OverWrite)
			return true;

		DIR *dp = opendir(base_directory.c_str());
		if (!dp)
			return false;

		while (auto *pEntry = readdir(dp))
		{
			if (shutdown_requested.load(std::memory_order_relaxed))
				return false;

			if (pEntry->d_type != DT_REG)
				continue;

			unsigned tag;
			uint64_t value;
			if (sscanf(pEntry->d_name, "%x.%" SCNx64 ".json", &tag, &value) != 2)
				continue;

			if (tag >= RESOURCE_COUNT)
				continue;

			if (test_resource_filter(static_cast<ResourceTag>(tag), value))
				seen_blobs[tag].insert(value);
		}

		closedir(dp);
		return true;
	}